

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_hex
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  bool bVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  uint uVar4;
  int num_digits;
  string_view prefix;
  write_int_data<char> data;
  write_int_data<char> local_70;
  anon_class_48_3_ff6d91eb local_60;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = '0';
    cVar1 = specs->type;
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = cVar1;
  }
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar2 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar2);
  bVar3.container = (this->out).container;
  uVar4 = this->prefix_size;
  prefix.size_._0_4_ = uVar4;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_70,num_digits,prefix,specs);
  local_60.data.size = local_70.size;
  local_60.data.padding = local_70.padding;
  local_60.prefix.data_ = this->prefix;
  local_60.prefix.size_ = (ulong)uVar4;
  local_60.f.this =
       (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
        *)this;
  local_60.f.num_digits = num_digits;
  bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_hex()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,int,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_hex()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                    (bVar3,specs,local_70.size,local_70.size,&local_60);
  (this->out).container = bVar3.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }